

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lighting_database.cpp
# Opt level: O2

void LightingDb::create_dir_light(void)

{
  size_t sVar1;
  vec3 local_d8;
  DirectionalLight local_cc;
  vec3 local_98;
  vec3 local_88;
  vec3 local_78;
  PhongLight local_6c;
  size_t local_48;
  float local_40;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aStack_3c;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_38;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aStack_34;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_30;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_2c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aStack_28;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aStack_24;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 local_20;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aStack_1c;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aStack_18;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_14;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_10;
  
  sVar1 = create_dir_light::directional_light_counter;
  create_dir_light::directional_light_counter = create_dir_light::directional_light_counter + 1;
  local_d8.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_d8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  local_d8.field_2.z = 1.0;
  local_78.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3dcccccd;
  local_78.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3dcccccd;
  local_78.field_2.z = 0.1;
  local_88.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  local_88.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  local_88.field_2.z = 1.0;
  local_98.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3dcccccd;
  local_98.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3dcccccd;
  local_98.field_2.z = 0.1;
  PhongLight::PhongLight(&local_6c,&local_78,&local_88,&local_98);
  DirectionalLight::DirectionalLight(&local_cc,&local_d8,&local_6c);
  local_48 = sVar1;
  local_40 = local_cc.m_shininess;
  aStack_3c = local_cc.m_direction.field_0;
  aStack_38 = local_cc.m_direction.field_1;
  aStack_34 = local_cc.m_direction.field_2;
  local_30 = local_cc.m_phong.m_ambient.field_0;
  aStack_2c = local_cc.m_phong.m_ambient.field_1;
  aStack_28 = local_cc.m_phong.m_ambient.field_2;
  aStack_24 = local_cc.m_phong.m_diffuse.field_0;
  local_20 = local_cc.m_phong.m_diffuse.field_1;
  aStack_1c = local_cc.m_phong.m_diffuse.field_2;
  aStack_18 = local_cc.m_phong.m_specular.field_0;
  aStack_14 = local_cc.m_phong.m_specular.field_1;
  local_10 = local_cc.m_phong.m_specular.field_2;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,DirectionalLight>,std::allocator<std::pair<unsigned_long_const,DirectionalLight>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<unsigned_long,DirectionalLight>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,DirectionalLight>,std::allocator<std::pair<unsigned_long_const,DirectionalLight>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)dir_map);
  return;
}

Assistant:

void LightingDb::create_dir_light() noexcept
{
    static std::size_t directional_light_counter = 1;
    dir_map.emplace(
        std::make_pair(
            directional_light_counter++,
            DirectionalLight(
                {1.0f, 1.0f, 1.0f},
                PhongLight(
                    {0.1f, 0.1f, 0.1f},
                    {1.0f, 1.0f, 1.0f},
                    {0.1f, 0.1f, 0.1f}))));
}